

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseConstList(WastParser *this,ConstVector *consts)

{
  bool bVar1;
  Result RVar2;
  undefined1 local_a8 [8];
  Const const_;
  ConstVector *consts_local;
  WastParser *this_local;
  
  while( true ) {
    bVar1 = PeekMatchLpar(this,Const);
    if (!bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    Consume((Token *)((long)&const_.field_2 + 8),this);
    Token::~Token((Token *)((long)&const_.field_2 + 8));
    Const::Const((Const *)local_a8);
    RVar2 = ParseConst(this,(Const *)local_a8);
    bVar1 = Failed(RVar2);
    if (bVar1) break;
    RVar2 = Expect(this,Rpar);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    std::vector<wabt::Const,_std::allocator<wabt::Const>_>::push_back(consts,(value_type *)local_a8)
    ;
  }
  Result::Result((Result *)((long)&this_local + 4),Error);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseConstList(ConstVector* consts) {
  WABT_TRACE(ParseConstList);
  while (PeekMatchLpar(TokenType::Const)) {
    Consume();
    Const const_;
    CHECK_RESULT(ParseConst(&const_));
    EXPECT(Rpar);
    consts->push_back(const_);
  }

  return Result::Ok;
}